

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * wasm::extendF32<(wasm::LaneOrder)0>(Literal *__return_storage_ptr__,Literal *vec)

{
  long lVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 *this;
  float fVar2;
  undefined1 local_d8 [8];
  LaneArray<4> lanes;
  LaneArray<2> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  undefined8 local_30;
  
  Literal::getLanesF32x4((LaneArray<4> *)local_d8,vec);
  lanes._M_elems[3].type.id = 0;
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    fVar2 = Literal::getf32((Literal *)(local_d8 + lVar1));
    local_40.i64 = (int64_t)(double)fVar2;
    local_30 = 5;
    this = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)&lanes._M_elems[3].type.id + lVar1);
    if (this != &local_40) {
      Literal::~Literal((Literal *)&this->func);
      Literal::Literal((Literal *)&this->func,(Literal *)&local_40.func);
    }
    Literal::~Literal((Literal *)&local_40.func);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&lanes._M_elems[3].type);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&lanes._M_elems[3].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Literal extendF32(const Literal& vec) {
  LaneArray<4> lanes = vec.getLanesF32x4();
  LaneArray<2> result;
  for (size_t i = 0; i < 2; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + 2;
    result[i] = Literal((double)lanes[idx].getf32());
  }
  return Literal(result);
}